

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linei_intersector.h
# Opt level: O3

void embree::avx::FlatLinearCurveMiIntersector1<8,_true>::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *line)

{
  undefined4 uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  Geometry *pGVar8;
  long lVar9;
  RTCFilterFunctionN p_Var10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  uint uVar16;
  uint uVar17;
  uint uVar18;
  Scene *pSVar19;
  ulong uVar20;
  float fVar21;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  float fVar33;
  float fVar39;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar37;
  float fVar38;
  float fVar40;
  float fVar41;
  float fVar42;
  undefined1 auVar36 [32];
  float fVar43;
  float fVar44;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  float fVar53;
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [64];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float in_register_0000151c;
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  LineIntersectorHitM<8> hit;
  int local_2f4;
  Scene *local_2f0;
  RayQueryContext *local_2e8;
  float local_2e0;
  undefined4 local_2dc;
  undefined4 local_2d8;
  undefined4 local_2d4;
  undefined4 local_2d0;
  uint local_2cc;
  uint local_2c8;
  uint local_2c4;
  uint local_2c0;
  RTCFilterFunctionNArguments local_2b0;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [16];
  undefined1 local_210 [16];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar61 [64];
  
  local_2e8 = context;
  pSVar19 = context->scene;
  uVar16 = line->sharedGeomID;
  uVar18 = (line->v0).field_0.i[0];
  local_2f0 = pSVar19;
  pGVar8 = (pSVar19->geometries).items[uVar16].ptr;
  lVar9 = *(long *)&pGVar8[1].time_range.upper;
  p_Var10 = pGVar8[1].intersectionFilterN;
  uVar17 = (line->v0).field_0.i[1];
  uVar2 = (line->v0).field_0.i[2];
  uVar3 = (line->v0).field_0.i[4];
  auVar22._16_16_ = *(undefined1 (*) [16])(lVar9 + (ulong)uVar3 * (long)p_Var10);
  auVar22._0_16_ = *(undefined1 (*) [16])(lVar9 + (ulong)uVar18 * (long)p_Var10);
  uVar4 = (line->v0).field_0.i[3];
  uVar5 = (line->v0).field_0.i[5];
  auVar36._16_16_ = *(undefined1 (*) [16])(lVar9 + (ulong)uVar5 * (long)p_Var10);
  auVar36._0_16_ = *(undefined1 (*) [16])(lVar9 + (ulong)uVar17 * (long)p_Var10);
  uVar6 = (line->v0).field_0.i[6];
  auVar45._16_16_ = *(undefined1 (*) [16])(lVar9 + (ulong)uVar6 * (long)p_Var10);
  auVar45._0_16_ = *(undefined1 (*) [16])(lVar9 + (ulong)uVar2 * (long)p_Var10);
  uVar7 = (line->v0).field_0.i[7];
  auVar54._16_16_ = *(undefined1 (*) [16])(lVar9 + (ulong)uVar7 * (long)p_Var10);
  auVar54._0_16_ = *(undefined1 (*) [16])(lVar9 + (ulong)uVar4 * (long)p_Var10);
  auVar58._16_16_ = *(undefined1 (*) [16])(lVar9 + (ulong)(uVar3 + 1) * (long)p_Var10);
  auVar58._0_16_ = *(undefined1 (*) [16])(lVar9 + (ulong)(uVar18 + 1) * (long)p_Var10);
  auVar62._16_16_ = *(undefined1 (*) [16])(lVar9 + (ulong)(uVar5 + 1) * (long)p_Var10);
  auVar62._0_16_ = *(undefined1 (*) [16])(lVar9 + (ulong)(uVar17 + 1) * (long)p_Var10);
  auVar64._16_16_ = *(undefined1 (*) [16])(lVar9 + (ulong)(uVar6 + 1) * (long)p_Var10);
  auVar64._0_16_ = *(undefined1 (*) [16])(lVar9 + (ulong)(uVar2 + 1) * (long)p_Var10);
  auVar68._16_16_ = *(undefined1 (*) [16])(lVar9 + (ulong)(uVar7 + 1) * (long)p_Var10);
  auVar68._0_16_ = *(undefined1 (*) [16])(lVar9 + (ulong)(uVar4 + 1) * (long)p_Var10);
  auVar13 = vunpcklps_avx(auVar22,auVar45);
  auVar25 = vunpckhps_avx(auVar22,auVar45);
  auVar22 = vunpcklps_avx(auVar36,auVar54);
  auVar11 = vunpckhps_avx(auVar36,auVar54);
  local_280 = vunpcklps_avx(auVar13,auVar22);
  local_120 = vunpckhps_avx(auVar13,auVar22);
  local_140 = vunpcklps_avx(auVar25,auVar11);
  local_80 = vunpckhps_avx(auVar25,auVar11);
  auVar13 = vunpcklps_avx(auVar58,auVar64);
  auVar25 = vunpckhps_avx(auVar58,auVar64);
  auVar22 = vunpcklps_avx(auVar62,auVar68);
  auVar12 = vunpckhps_avx(auVar62,auVar68);
  local_e0 = vunpcklps_avx(auVar13,auVar22);
  local_100 = vunpckhps_avx(auVar13,auVar22);
  local_240 = vunpcklps_avx(auVar25,auVar12);
  auVar34 = vpcmpeqd_avx(auVar13._0_16_,auVar13._0_16_);
  auVar35 = vpcmpeqd_avx(auVar34,*(undefined1 (*) [16])(line->primIDs).field_0.field_1.vl);
  local_c0 = vunpckhps_avx(auVar25,auVar12);
  auVar34 = vpcmpeqd_avx(auVar34,*(undefined1 (*) [16])((long)&(line->primIDs).field_0 + 0x10));
  local_210 = vshufps_avx(ZEXT416(uVar16),ZEXT416(uVar16),0);
  local_220 = local_210;
  fVar21 = (pre->ray_space).vy.field_0.m128[0];
  fVar27 = (pre->ray_space).vz.field_0.m128[0];
  uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
  auVar80._4_4_ = uVar1;
  auVar80._0_4_ = uVar1;
  auVar80._8_4_ = uVar1;
  auVar80._12_4_ = uVar1;
  auVar80._16_4_ = uVar1;
  auVar80._20_4_ = uVar1;
  auVar80._24_4_ = uVar1;
  auVar80._28_4_ = uVar1;
  local_a0._16_16_ = auVar34;
  local_a0._0_16_ = auVar35;
  uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
  auVar82._4_4_ = uVar1;
  auVar82._0_4_ = uVar1;
  auVar82._8_4_ = uVar1;
  auVar82._12_4_ = uVar1;
  auVar82._16_4_ = uVar1;
  auVar82._20_4_ = uVar1;
  auVar82._24_4_ = uVar1;
  auVar82._28_4_ = uVar1;
  auVar25 = vsubps_avx(local_120,auVar80);
  auVar13 = vsubps_avx(local_140,auVar82);
  fVar44 = auVar13._0_4_;
  fVar41 = auVar13._4_4_;
  fVar33 = auVar13._8_4_;
  fVar43 = auVar13._12_4_;
  fVar50 = auVar13._16_4_;
  fVar52 = auVar13._20_4_;
  fVar70 = auVar13._24_4_;
  fVar40 = auVar25._0_4_;
  fVar48 = auVar25._4_4_;
  fVar37 = auVar25._8_4_;
  fVar49 = auVar25._12_4_;
  fVar51 = auVar25._16_4_;
  fVar53 = auVar25._20_4_;
  fVar71 = auVar25._24_4_;
  fVar28 = (pre->ray_space).vy.field_0.m128[1];
  auVar35 = vpermilps_avx((undefined1  [16])(pre->ray_space).vy.field_0,0xaa);
  fVar29 = (pre->ray_space).vz.field_0.m128[1];
  fVar30 = (pre->ray_space).vz.field_0.m128[2];
  fVar47 = auVar35._0_4_;
  fVar42 = auVar35._4_4_;
  fVar38 = auVar35._8_4_;
  fVar31 = (pre->ray_space).vx.field_0.m128[0];
  uVar1 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
  auVar65._4_4_ = uVar1;
  auVar65._0_4_ = uVar1;
  auVar65._8_4_ = uVar1;
  auVar65._12_4_ = uVar1;
  auVar65._16_4_ = uVar1;
  auVar65._20_4_ = uVar1;
  auVar65._24_4_ = uVar1;
  auVar65._28_4_ = uVar1;
  auVar22 = vsubps_avx(local_280,auVar65);
  fVar72 = auVar22._0_4_;
  fVar73 = auVar22._4_4_;
  fVar74 = auVar22._8_4_;
  fVar75 = auVar22._12_4_;
  fVar76 = auVar22._16_4_;
  fVar77 = auVar22._20_4_;
  fVar78 = auVar22._24_4_;
  auVar69._0_4_ = fVar72 * fVar31 + fVar21 * fVar40 + fVar27 * fVar44;
  auVar69._4_4_ = fVar73 * fVar31 + fVar21 * fVar48 + fVar27 * fVar41;
  auVar69._8_4_ = fVar74 * fVar31 + fVar21 * fVar37 + fVar27 * fVar33;
  auVar69._12_4_ = fVar75 * fVar31 + fVar21 * fVar49 + fVar27 * fVar43;
  auVar69._16_4_ = fVar76 * fVar31 + fVar21 * fVar51 + fVar27 * fVar50;
  auVar69._20_4_ = fVar77 * fVar31 + fVar21 * fVar53 + fVar27 * fVar52;
  auVar69._24_4_ = fVar78 * fVar31 + fVar21 * fVar71 + fVar27 * fVar70;
  auVar69._28_4_ = auVar13._28_4_ + auVar12._28_4_ + in_register_0000151c;
  fVar32 = (pre->ray_space).vx.field_0.m128[1];
  auVar46._0_4_ = fVar32 * fVar72 + fVar40 * fVar28 + fVar44 * fVar29;
  auVar46._4_4_ = fVar32 * fVar73 + fVar48 * fVar28 + fVar41 * fVar29;
  auVar46._8_4_ = fVar32 * fVar74 + fVar37 * fVar28 + fVar33 * fVar29;
  auVar46._12_4_ = fVar32 * fVar75 + fVar49 * fVar28 + fVar43 * fVar29;
  auVar46._16_4_ = fVar32 * fVar76 + fVar51 * fVar28 + fVar50 * fVar29;
  auVar46._20_4_ = fVar32 * fVar77 + fVar53 * fVar28 + fVar52 * fVar29;
  auVar46._24_4_ = fVar32 * fVar78 + fVar71 * fVar28 + fVar70 * fVar29;
  auVar46._28_4_ = local_280._28_4_ + auVar11._28_4_ + auVar34._12_4_;
  fVar39 = (pre->ray_space).vx.field_0.m128[2];
  auVar79._0_4_ = fVar72 * fVar39 + fVar40 * fVar47 + fVar44 * fVar30;
  auVar79._4_4_ = fVar73 * fVar39 + fVar48 * fVar42 + fVar41 * fVar30;
  auVar79._8_4_ = fVar74 * fVar39 + fVar37 * fVar38 + fVar33 * fVar30;
  auVar79._12_4_ = fVar75 * fVar39 + fVar49 * auVar35._12_4_ + fVar43 * fVar30;
  auVar79._16_4_ = fVar76 * fVar39 + fVar51 * fVar47 + fVar50 * fVar30;
  auVar79._20_4_ = fVar77 * fVar39 + fVar53 * fVar42 + fVar52 * fVar30;
  auVar79._24_4_ = fVar78 * fVar39 + fVar71 * fVar38 + fVar70 * fVar30;
  auVar79._28_4_ = auVar22._28_4_ + auVar25._28_4_ + auVar13._28_4_;
  auVar25 = vsubps_avx(local_240,auVar82);
  fVar44 = auVar25._0_4_;
  fVar48 = auVar25._4_4_;
  fVar43 = auVar25._8_4_;
  fVar51 = auVar25._12_4_;
  fVar70 = auVar25._16_4_;
  fVar73 = auVar25._20_4_;
  fVar76 = auVar25._24_4_;
  auVar25 = vsubps_avx(local_100,auVar80);
  fVar40 = auVar25._0_4_;
  fVar33 = auVar25._4_4_;
  fVar49 = auVar25._8_4_;
  fVar52 = auVar25._12_4_;
  fVar71 = auVar25._16_4_;
  fVar74 = auVar25._20_4_;
  fVar77 = auVar25._24_4_;
  auVar25 = vsubps_avx(local_e0,auVar65);
  fVar41 = auVar25._0_4_;
  fVar37 = auVar25._4_4_;
  fVar50 = auVar25._8_4_;
  fVar53 = auVar25._12_4_;
  fVar72 = auVar25._16_4_;
  fVar75 = auVar25._20_4_;
  fVar78 = auVar25._24_4_;
  auVar59._0_4_ = fVar21 * fVar40 + fVar27 * fVar44 + fVar31 * fVar41;
  auVar59._4_4_ = fVar21 * fVar33 + fVar27 * fVar48 + fVar31 * fVar37;
  auVar59._8_4_ = fVar21 * fVar49 + fVar27 * fVar43 + fVar31 * fVar50;
  auVar59._12_4_ = fVar21 * fVar52 + fVar27 * fVar51 + fVar31 * fVar53;
  auVar59._16_4_ = fVar21 * fVar71 + fVar27 * fVar70 + fVar31 * fVar72;
  auVar59._20_4_ = fVar21 * fVar74 + fVar27 * fVar73 + fVar31 * fVar75;
  auVar59._24_4_ = fVar21 * fVar77 + fVar27 * fVar76 + fVar31 * fVar78;
  auVar59._28_4_ = fVar21 + fVar27 + fVar30;
  auVar23._0_4_ = fVar32 * fVar41 + fVar40 * fVar28 + fVar44 * fVar29;
  auVar23._4_4_ = fVar32 * fVar37 + fVar33 * fVar28 + fVar48 * fVar29;
  auVar23._8_4_ = fVar32 * fVar50 + fVar49 * fVar28 + fVar43 * fVar29;
  auVar23._12_4_ = fVar32 * fVar53 + fVar52 * fVar28 + fVar51 * fVar29;
  auVar23._16_4_ = fVar32 * fVar72 + fVar71 * fVar28 + fVar70 * fVar29;
  auVar23._20_4_ = fVar32 * fVar75 + fVar74 * fVar28 + fVar73 * fVar29;
  auVar23._24_4_ = fVar32 * fVar78 + fVar77 * fVar28 + fVar76 * fVar29;
  auVar23._28_4_ = fVar31 + fVar28 + fVar29;
  auVar81._0_4_ = fVar39 * fVar41 + fVar40 * fVar47 + fVar44 * fVar30;
  auVar81._4_4_ = fVar39 * fVar37 + fVar33 * fVar42 + fVar48 * fVar30;
  auVar81._8_4_ = fVar39 * fVar50 + fVar49 * fVar38 + fVar43 * fVar30;
  auVar81._12_4_ = fVar39 * fVar53 + fVar52 * auVar35._12_4_ + fVar51 * fVar30;
  auVar81._16_4_ = fVar39 * fVar72 + fVar71 * fVar47 + fVar70 * fVar30;
  auVar81._20_4_ = fVar39 * fVar75 + fVar74 * fVar42 + fVar73 * fVar30;
  auVar81._24_4_ = fVar39 * fVar78 + fVar77 * fVar38 + fVar76 * fVar30;
  auVar81._28_4_ = auVar25._28_4_ + fVar29 + fVar30;
  auVar13 = vsubps_avx(auVar59,auVar69);
  auVar22 = vsubps_avx(auVar23,auVar46);
  fVar21 = auVar22._0_4_;
  fVar28 = auVar22._4_4_;
  fVar30 = auVar22._8_4_;
  fVar32 = auVar22._12_4_;
  fVar44 = auVar22._16_4_;
  fVar47 = auVar22._20_4_;
  fVar48 = auVar22._24_4_;
  fVar27 = auVar13._0_4_;
  fVar29 = auVar13._4_4_;
  fVar31 = auVar13._8_4_;
  fVar39 = auVar13._12_4_;
  fVar40 = auVar13._16_4_;
  fVar41 = auVar13._20_4_;
  fVar42 = auVar13._24_4_;
  auVar55._0_4_ = fVar27 * fVar27 + fVar21 * fVar21;
  auVar55._4_4_ = fVar29 * fVar29 + fVar28 * fVar28;
  auVar55._8_4_ = fVar31 * fVar31 + fVar30 * fVar30;
  auVar55._12_4_ = fVar39 * fVar39 + fVar32 * fVar32;
  auVar55._16_4_ = fVar40 * fVar40 + fVar44 * fVar44;
  auVar55._20_4_ = fVar41 * fVar41 + fVar47 * fVar47;
  auVar55._24_4_ = fVar42 * fVar42 + fVar48 * fVar48;
  auVar55._28_4_ = auVar59._28_4_ + auVar25._28_4_;
  auVar11._4_4_ = fVar28 * -auVar46._4_4_;
  auVar11._0_4_ = fVar21 * -auVar46._0_4_;
  auVar11._8_4_ = fVar30 * -auVar46._8_4_;
  auVar11._12_4_ = fVar32 * -auVar46._12_4_;
  auVar11._16_4_ = fVar44 * -auVar46._16_4_;
  auVar11._20_4_ = fVar47 * -auVar46._20_4_;
  auVar11._24_4_ = fVar48 * -auVar46._24_4_;
  auVar11._28_4_ = -auVar46._28_4_;
  auVar25 = vrcpps_avx(auVar55);
  auVar12._4_4_ = auVar69._4_4_ * fVar29;
  auVar12._0_4_ = auVar69._0_4_ * fVar27;
  auVar12._8_4_ = auVar69._8_4_ * fVar31;
  auVar12._12_4_ = auVar69._12_4_ * fVar39;
  auVar12._16_4_ = auVar69._16_4_ * fVar40;
  auVar12._20_4_ = auVar69._20_4_ * fVar41;
  auVar12._24_4_ = auVar69._24_4_ * fVar42;
  auVar12._28_4_ = uVar1;
  auVar11 = vsubps_avx(auVar11,auVar12);
  auVar66._8_4_ = 0x3f800000;
  auVar66._0_8_ = 0x3f8000003f800000;
  auVar66._12_4_ = 0x3f800000;
  auVar66._16_4_ = 0x3f800000;
  auVar66._20_4_ = 0x3f800000;
  auVar66._24_4_ = 0x3f800000;
  auVar66._28_4_ = 0x3f800000;
  fVar33 = auVar25._0_4_;
  fVar37 = auVar25._4_4_;
  auVar14._4_4_ = fVar37 * auVar55._4_4_;
  auVar14._0_4_ = fVar33 * auVar55._0_4_;
  fVar38 = auVar25._8_4_;
  auVar14._8_4_ = fVar38 * auVar55._8_4_;
  fVar43 = auVar25._12_4_;
  auVar14._12_4_ = fVar43 * auVar55._12_4_;
  fVar49 = auVar25._16_4_;
  auVar14._16_4_ = fVar49 * auVar55._16_4_;
  fVar50 = auVar25._20_4_;
  auVar14._20_4_ = fVar50 * auVar55._20_4_;
  fVar51 = auVar25._24_4_;
  auVar14._24_4_ = fVar51 * auVar55._24_4_;
  auVar14._28_4_ = auVar55._28_4_;
  auVar12 = vsubps_avx(auVar66,auVar14);
  auVar15._4_4_ = auVar11._4_4_ * (fVar37 + fVar37 * auVar12._4_4_);
  auVar15._0_4_ = auVar11._0_4_ * (fVar33 + fVar33 * auVar12._0_4_);
  auVar15._8_4_ = auVar11._8_4_ * (fVar38 + fVar38 * auVar12._8_4_);
  auVar15._12_4_ = auVar11._12_4_ * (fVar43 + fVar43 * auVar12._12_4_);
  auVar15._16_4_ = auVar11._16_4_ * (fVar49 + fVar49 * auVar12._16_4_);
  auVar15._20_4_ = auVar11._20_4_ * (fVar50 + fVar50 * auVar12._20_4_);
  auVar15._24_4_ = auVar11._24_4_ * (fVar51 + fVar51 * auVar12._24_4_);
  auVar15._28_4_ = auVar25._28_4_ + auVar12._28_4_;
  auVar25 = vminps_avx(auVar15,auVar66);
  local_200 = vmaxps_avx(auVar25,ZEXT832(0) << 0x20);
  fVar49 = local_200._0_4_;
  fVar50 = local_200._4_4_;
  fVar51 = local_200._8_4_;
  fVar52 = local_200._12_4_;
  fVar53 = local_200._16_4_;
  fVar70 = local_200._20_4_;
  fVar71 = local_200._24_4_;
  fVar33 = auVar69._0_4_ + fVar49 * fVar27;
  fVar37 = auVar69._4_4_ + fVar50 * fVar29;
  fVar38 = auVar69._8_4_ + fVar51 * fVar31;
  fVar39 = auVar69._12_4_ + fVar52 * fVar39;
  fVar40 = auVar69._16_4_ + fVar53 * fVar40;
  fVar41 = auVar69._20_4_ + fVar70 * fVar41;
  fVar42 = auVar69._24_4_ + fVar71 * fVar42;
  fVar43 = auVar69._28_4_ + auVar13._28_4_;
  fVar21 = auVar46._0_4_ + fVar49 * fVar21;
  fVar27 = auVar46._4_4_ + fVar50 * fVar28;
  fVar28 = auVar46._8_4_ + fVar51 * fVar30;
  fVar29 = auVar46._12_4_ + fVar52 * fVar32;
  fVar30 = auVar46._16_4_ + fVar53 * fVar44;
  fVar31 = auVar46._20_4_ + fVar70 * fVar47;
  fVar32 = auVar46._24_4_ + fVar71 * fVar48;
  auVar25 = vsubps_avx(auVar81,auVar79);
  local_1c0._0_4_ = auVar79._0_4_ + fVar49 * auVar25._0_4_;
  local_1c0._4_4_ = auVar79._4_4_ + fVar50 * auVar25._4_4_;
  local_1c0._8_4_ = auVar79._8_4_ + fVar51 * auVar25._8_4_;
  local_1c0._12_4_ = auVar79._12_4_ + fVar52 * auVar25._12_4_;
  local_1c0._16_4_ = auVar79._16_4_ + fVar53 * auVar25._16_4_;
  local_1c0._20_4_ = auVar79._20_4_ + fVar70 * auVar25._20_4_;
  local_1c0._24_4_ = auVar79._24_4_ + fVar71 * auVar25._24_4_;
  local_1c0._28_4_ = auVar79._28_4_ + auVar25._28_4_;
  auVar63 = ZEXT3264(local_1c0);
  auVar25 = vsubps_avx(local_c0,local_80);
  fVar44 = local_80._0_4_ + fVar49 * auVar25._0_4_;
  fVar47 = local_80._4_4_ + fVar50 * auVar25._4_4_;
  fVar48 = local_80._8_4_ + fVar51 * auVar25._8_4_;
  fVar49 = local_80._12_4_ + fVar52 * auVar25._12_4_;
  fVar50 = local_80._16_4_ + fVar53 * auVar25._16_4_;
  fVar51 = local_80._20_4_ + fVar70 * auVar25._20_4_;
  fVar52 = local_80._24_4_ + fVar71 * auVar25._24_4_;
  fVar53 = local_80._28_4_ + auVar25._28_4_;
  auVar24._0_4_ = fVar33 * fVar33 + fVar21 * fVar21;
  auVar24._4_4_ = fVar37 * fVar37 + fVar27 * fVar27;
  auVar24._8_4_ = fVar38 * fVar38 + fVar28 * fVar28;
  auVar24._12_4_ = fVar39 * fVar39 + fVar29 * fVar29;
  auVar24._16_4_ = fVar40 * fVar40 + fVar30 * fVar30;
  auVar24._20_4_ = fVar41 * fVar41 + fVar31 * fVar31;
  auVar24._24_4_ = fVar42 * fVar42 + fVar32 * fVar32;
  auVar24._28_4_ = fVar43 + auVar46._28_4_ + auVar22._28_4_;
  auVar25._4_4_ = fVar47 * fVar47;
  auVar25._0_4_ = fVar44 * fVar44;
  auVar25._8_4_ = fVar48 * fVar48;
  auVar25._12_4_ = fVar49 * fVar49;
  auVar25._16_4_ = fVar50 * fVar50;
  auVar25._20_4_ = fVar51 * fVar51;
  auVar25._24_4_ = fVar52 * fVar52;
  auVar25._28_4_ = fVar43;
  uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar56._4_4_ = uVar1;
  auVar56._0_4_ = uVar1;
  auVar56._8_4_ = uVar1;
  auVar56._12_4_ = uVar1;
  auVar56._16_4_ = uVar1;
  auVar56._20_4_ = uVar1;
  auVar56._24_4_ = uVar1;
  auVar56._28_4_ = uVar1;
  auVar13 = vcmpps_avx(auVar24,auVar25,2);
  auVar25 = vcmpps_avx(auVar56,local_1c0,2);
  fVar21 = (ray->super_RayK<1>).tfar;
  auVar57._4_4_ = fVar21;
  auVar57._0_4_ = fVar21;
  auVar57._8_4_ = fVar21;
  auVar57._12_4_ = fVar21;
  auVar57._16_4_ = fVar21;
  auVar57._20_4_ = fVar21;
  auVar57._24_4_ = fVar21;
  auVar57._28_4_ = fVar21;
  auVar22 = vcmpps_avx(local_1c0,auVar57,2);
  auVar25 = vandps_avx(auVar22,auVar25);
  fVar21 = pre->depth_scale;
  auVar25 = vandps_avx(auVar25,auVar13);
  auVar13._4_4_ = fVar21 * (fVar47 + fVar47);
  auVar13._0_4_ = fVar21 * (fVar44 + fVar44);
  auVar13._8_4_ = fVar21 * (fVar48 + fVar48);
  auVar13._12_4_ = fVar21 * (fVar49 + fVar49);
  auVar13._16_4_ = fVar21 * (fVar50 + fVar50);
  auVar13._20_4_ = fVar21 * (fVar51 + fVar51);
  auVar13._24_4_ = fVar21 * (fVar52 + fVar52);
  auVar13._28_4_ = fVar53 + fVar53;
  auVar13 = vcmpps_avx(local_1c0,auVar13,6);
  auVar25 = vandps_avx(auVar13,auVar25);
  auVar34 = vpslld_avx(auVar25._0_16_,0x1f);
  auVar35 = vpsrad_avx(auVar34,0x1f);
  auVar34 = vpslld_avx(auVar25._16_16_,0x1f);
  auVar34 = vpsrad_avx(auVar34,0x1f);
  auVar67._16_16_ = auVar34;
  auVar67._0_16_ = auVar35;
  auVar25 = auVar67 & ~local_a0;
  if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar25 >> 0x7f,0) != '\0') ||
        (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar25 >> 0xbf,0) != '\0') ||
      (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar25[0x1f] < '\0') {
    auVar25 = vandnps_avx(local_a0,auVar67);
    local_1a0 = vsubps_avx(local_e0,local_280);
    local_180 = vsubps_avx(local_100,local_120);
    local_160 = vsubps_avx(local_240,local_140);
    auVar13 = vcmpps_avx(ZEXT832(0) << 0x20,local_1a0,4);
    auVar22 = vcmpps_avx(ZEXT832(0) << 0x20,local_180,4);
    auVar22 = vorps_avx(auVar13,auVar22);
    auVar13 = vcmpps_avx(ZEXT832(0) << 0x20,local_160,4);
    auVar13 = vorps_avx(auVar22,auVar13);
    auVar22 = auVar25 & auVar13;
    if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar22 >> 0x7f,0) != '\0') ||
          (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar22 >> 0xbf,0) != '\0') ||
        (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar22[0x1f] < '\0')
    {
      uVar16 = (ray->super_RayK<1>).mask;
      fVar21 = (ray->super_RayK<1>).tfar;
      auVar25 = vandps_avx(auVar13,auVar25);
      local_1e0 = ZEXT832(0) << 0x20;
      local_260 = auVar25;
      auVar60._8_4_ = 0x7f800000;
      auVar60._0_8_ = 0x7f8000007f800000;
      auVar60._12_4_ = 0x7f800000;
      auVar60._16_4_ = 0x7f800000;
      auVar60._20_4_ = 0x7f800000;
      auVar60._24_4_ = 0x7f800000;
      auVar60._28_4_ = 0x7f800000;
      auVar61 = ZEXT3264(auVar60);
      auVar13 = vblendvps_avx(auVar60,local_1c0,auVar25);
      auVar22 = vshufps_avx(auVar13,auVar13,0xb1);
      auVar22 = vminps_avx(auVar13,auVar22);
      auVar11 = vshufpd_avx(auVar22,auVar22,5);
      auVar22 = vminps_avx(auVar22,auVar11);
      auVar11 = vperm2f128_avx(auVar22,auVar22,1);
      auVar22 = vminps_avx(auVar22,auVar11);
      auVar13 = vcmpps_avx(auVar13,auVar22,0);
      auVar22 = auVar25 & auVar13;
      if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar22 >> 0x7f,0) != '\0') ||
            (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar22 >> 0xbf,0) != '\0') ||
          (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar22[0x1f] < '\0') {
        auVar25 = vandps_avx(auVar13,auVar25);
      }
      uVar17 = vmovmskps_avx(auVar25);
      uVar18 = 0;
      if (uVar17 != 0) {
        for (; (uVar17 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
        }
      }
      do {
        uVar20 = (ulong)uVar18;
        local_2c8 = *(uint *)(local_220 + uVar20 * 4);
        pGVar8 = (pSVar19->geometries).items[local_2c8].ptr;
        if ((pGVar8->mask & uVar16) == 0) {
          *(undefined4 *)(local_260 + uVar20 * 4) = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            fVar21 = *(float *)(local_200 + uVar20 * 4);
            fVar27 = *(float *)(local_1e0 + uVar20 * 4);
            (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar20 * 4);
            (ray->Ng).field_0.field_0.x = *(float *)(local_1a0 + uVar20 * 4);
            (ray->Ng).field_0.field_0.y = *(float *)(local_180 + uVar20 * 4);
            (ray->Ng).field_0.field_0.z = *(float *)(local_160 + uVar20 * 4);
            ray->u = fVar21;
            ray->v = fVar27;
            ray->primID = (line->primIDs).field_0.i[uVar20];
            ray->geomID = local_2c8;
            ray->instID[0] = context->user->instID[0];
            ray->instPrimID[0] = context->user->instPrimID[0];
            return;
          }
          local_240._0_4_ = fVar21;
          local_280 = auVar63._0_32_;
          local_2e0 = *(float *)(local_1a0 + uVar20 * 4);
          local_2dc = *(undefined4 *)(local_180 + uVar20 * 4);
          local_2d8 = *(undefined4 *)(local_160 + uVar20 * 4);
          local_2d4 = *(undefined4 *)(local_200 + uVar20 * 4);
          local_2d0 = *(undefined4 *)(local_1e0 + uVar20 * 4);
          local_2cc = (line->primIDs).field_0.i[uVar20];
          local_2c4 = context->user->instID[0];
          local_2c0 = context->user->instPrimID[0];
          (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar20 * 4);
          local_2f4 = -1;
          local_2b0.valid = &local_2f4;
          local_2b0.geometryUserPtr = pGVar8->userPtr;
          local_2b0.context = context->user;
          local_2b0.ray = (RTCRayN *)ray;
          local_2b0.hit = (RTCHitN *)&local_2e0;
          local_2b0.N = 1;
          if ((pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
             ((*pGVar8->intersectionFilterN)(&local_2b0), *local_2b0.valid != 0)) {
            p_Var10 = context->args->filter;
            if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
               ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                  RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0)) &&
                ((*p_Var10)(&local_2b0), *local_2b0.valid == 0)))) goto LAB_00fdde79;
            (((Vec3f *)((long)local_2b0.ray + 0x30))->field_0).field_0.x = *(float *)local_2b0.hit;
            (((Vec3f *)((long)local_2b0.ray + 0x30))->field_0).field_0.y =
                 *(float *)(local_2b0.hit + 4);
            (((Vec3f *)((long)local_2b0.ray + 0x30))->field_0).field_0.z =
                 *(float *)(local_2b0.hit + 8);
            *(float *)((long)local_2b0.ray + 0x3c) = *(float *)(local_2b0.hit + 0xc);
            *(float *)((long)local_2b0.ray + 0x40) = *(float *)(local_2b0.hit + 0x10);
            *(float *)((long)local_2b0.ray + 0x44) = *(float *)(local_2b0.hit + 0x14);
            *(float *)((long)local_2b0.ray + 0x48) = *(float *)(local_2b0.hit + 0x18);
            *(float *)((long)local_2b0.ray + 0x4c) = *(float *)(local_2b0.hit + 0x1c);
            *(float *)((long)local_2b0.ray + 0x50) = *(float *)(local_2b0.hit + 0x20);
          }
          else {
LAB_00fdde79:
            (ray->super_RayK<1>).tfar = (float)local_240._0_4_;
          }
          auVar61 = ZEXT3264(CONCAT428(0x7f800000,
                                       CONCAT424(0x7f800000,
                                                 CONCAT420(0x7f800000,
                                                           CONCAT416(0x7f800000,
                                                                     CONCAT412(0x7f800000,
                                                                               CONCAT48(0x7f800000,
                                                                                                                                                                                
                                                  0x7f8000007f800000)))))));
          *(undefined4 *)(local_260 + uVar20 * 4) = 0;
          fVar21 = (ray->super_RayK<1>).tfar;
          auVar26._4_4_ = fVar21;
          auVar26._0_4_ = fVar21;
          auVar26._8_4_ = fVar21;
          auVar26._12_4_ = fVar21;
          auVar26._16_4_ = fVar21;
          auVar26._20_4_ = fVar21;
          auVar26._24_4_ = fVar21;
          auVar26._28_4_ = fVar21;
          auVar63 = ZEXT3264(local_280);
          auVar25 = vcmpps_avx(local_280,auVar26,2);
          local_260 = vandps_avx(auVar25,local_260);
          uVar16 = (ray->super_RayK<1>).mask;
          fVar21 = (ray->super_RayK<1>).tfar;
          pSVar19 = local_2f0;
        }
        if ((((((((local_260 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_260 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_260 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_260 >> 0x7f,0) == '\0') &&
              (local_260 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_260 >> 0xbf,0) == '\0') &&
            (local_260 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_260[0x1f]) {
          return;
        }
        auVar25 = vblendvps_avx(auVar61._0_32_,auVar63._0_32_,local_260);
        auVar13 = vshufps_avx(auVar25,auVar25,0xb1);
        auVar13 = vminps_avx(auVar25,auVar13);
        auVar22 = vshufpd_avx(auVar13,auVar13,5);
        auVar13 = vminps_avx(auVar13,auVar22);
        auVar22 = vperm2f128_avx(auVar13,auVar13,1);
        auVar13 = vminps_avx(auVar13,auVar22);
        auVar13 = vcmpps_avx(auVar25,auVar13,0);
        auVar22 = local_260 & auVar13;
        auVar25 = local_260;
        if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar22 >> 0x7f,0) != '\0') ||
              (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar22 >> 0xbf,0) != '\0') ||
            (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar22[0x1f] < '\0') {
          auVar25 = vandps_avx(auVar13,local_260);
        }
        uVar17 = vmovmskps_avx(auVar25);
        uVar18 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
          }
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& line)
      {
        STAT3(normal.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; line.gather(v0,v1,geom);
        const vbool<M> valid = line.valid();
        FlatLinearCurveIntersector1<M>::intersect(valid,ray,context,geom,pre,v0,v1,Intersect1EpilogM<M,filter>(ray,context,line.geomID(),line.primID()));
      }